

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

void * deqp::egl::Image::checkCallError<void*>
                 (EglTestContext *eglTestCtx,char *call,void *returnValue,EGLint expectError)

{
  qpTestResult qVar1;
  MessageBuilder *pMVar2;
  Library *pLVar3;
  Enum<int,_2UL> EVar4;
  MessageBuilder local_510;
  GetNameFunc local_390;
  int local_388;
  Enum<int,_2UL> local_380;
  GetNameFunc local_370;
  int local_368;
  Enum<int,_2UL> local_360;
  MessageBuilder local_350;
  MessageBuilder local_1c0;
  int local_3c;
  TestLog *pTStack_38;
  EGLint error;
  TestLog *log;
  TestContext *testCtx;
  void *pvStack_20;
  EGLint expectError_local;
  void *returnValue_local;
  char *call_local;
  EglTestContext *eglTestCtx_local;
  
  testCtx._4_4_ = expectError;
  pvStack_20 = returnValue;
  returnValue_local = call;
  call_local = (char *)eglTestCtx;
  log = (TestLog *)EglTestContext::getTestContext(eglTestCtx);
  pTStack_38 = tcu::TestContext::getLog((TestContext *)log);
  tcu::TestLog::operator<<(&local_1c0,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1c0,(char **)&returnValue_local);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  pLVar3 = EglTestContext::getLibrary((EglTestContext *)call_local);
  local_3c = (*pLVar3->_vptr_Library[0x1f])();
  if (local_3c != testCtx._4_4_) {
    tcu::TestLog::operator<<(&local_350,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_350,(char (*) [39])"  Fail: Error code mismatch! Expected ");
    EVar4 = eglu::getErrorStr(testCtx._4_4_);
    local_370 = EVar4.m_getName;
    local_368 = EVar4.m_value;
    local_360.m_getName = local_370;
    local_360.m_value = local_368;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_360);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [7])0x5a779a);
    EVar4 = eglu::getErrorStr(local_3c);
    local_390 = EVar4.m_getName;
    local_388 = EVar4.m_value;
    local_380.m_getName = local_390;
    local_380.m_value = local_388;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_380);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_350);
    tcu::TestLog::operator<<(&local_510,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_510,(char (*) [3])0x589fc6);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&stack0xffffffffffffffe0);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])" was returned");
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_510);
    qVar1 = tcu::TestContext::getTestResult((TestContext *)log);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult((TestContext *)log,QP_TEST_RESULT_FAIL,"Invalid error code");
    }
  }
  return pvStack_20;
}

Assistant:

RetVal checkCallError (EglTestContext& eglTestCtx, const char* call, RetVal returnValue, EGLint expectError)
{
	tcu::TestContext&	testCtx		= eglTestCtx.getTestContext();
	TestLog&			log			= testCtx.getLog();
	EGLint				error;

	log << TestLog::Message << call << TestLog::EndMessage;

	error = eglTestCtx.getLibrary().getError();

	if (error != expectError)
	{
		log << TestLog::Message << "  Fail: Error code mismatch! Expected " << eglu::getErrorStr(expectError) << ", got " << eglu::getErrorStr(error) << TestLog::EndMessage;
		log << TestLog::Message << "  " << returnValue << " was returned" << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error code");
	}

	return returnValue;
}